

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfuturewatcher.cpp
# Opt level: O0

void QFutureWatcherBase::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QFutureWatcherBase *in_RDI;
  QFutureWatcherBase *_t;
  QFutureWatcherBase *in_stack_ffffffffffffff20;
  
  if (in_ESI == 0) {
    switch((QString *)(ulong)in_EDX) {
    case (QString *)0x0:
      started((QFutureWatcherBase *)0x6e772e);
      break;
    case (QString *)0x1:
      finished((QFutureWatcherBase *)0x6e7740);
      break;
    case (QString *)0x2:
      canceled((QFutureWatcherBase *)0x6e7752);
      break;
    case (QString *)0x3:
      paused((QFutureWatcherBase *)0x6e7764);
      break;
    case (QString *)0x4:
      suspending((QFutureWatcherBase *)0x6e7776);
      break;
    case (QString *)0x5:
      suspended((QFutureWatcherBase *)0x6e7788);
      break;
    case (QString *)0x6:
      resumed((QFutureWatcherBase *)0x6e779a);
      break;
    case (QString *)0x7:
      resultReadyAt((QFutureWatcherBase *)0x6e77ba,0);
      break;
    case (QString *)0x8:
      resultsReadyAt((QFutureWatcherBase *)0x6e77e8,0,in_EDX);
      break;
    case (QString *)0x9:
      progressRangeChanged((QFutureWatcherBase *)0x6e7816,0,in_EDX);
      break;
    case (QString *)0xa:
      progressValueChanged((QFutureWatcherBase *)0x6e7836,0);
      break;
    case (QString *)0xb:
      progressTextChanged(in_stack_ffffffffffffff20,(QString *)(ulong)in_EDX);
      break;
    case (QString *)0xc:
      cancel((QFutureWatcherBase *)0x6e7866);
      break;
    case (QString *)0xd:
      setSuspended(in_stack_ffffffffffffff20,false);
      break;
    case (QString *)0xe:
      suspend((QFutureWatcherBase *)0x6e789a);
      break;
    case (QString *)0xf:
      resume((QFutureWatcherBase *)0x6e78a9);
      break;
    case (QString *)0x10:
      toggleSuspended((QFutureWatcherBase *)0x6e78b8);
      break;
    case (QString *)0x11:
      setPaused(in_stack_ffffffffffffff20,false);
      break;
    case (QString *)0x12:
      pause(in_RDI);
      break;
    case (QString *)0x13:
      togglePaused((QFutureWatcherBase *)0x6e78f8);
    }
  }
  if (((((in_ESI == 5) &&
        (bVar1 = QtMocHelpers::indexOfMethod<void(QFutureWatcherBase::*)()>
                           (in_RCX,(void **)started,0,0), !bVar1)) &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QFutureWatcherBase::*)()>
                          (in_RCX,(void **)finished,0,1), !bVar1)) &&
      ((((bVar1 = QtMocHelpers::indexOfMethod<void(QFutureWatcherBase::*)()>
                            (in_RCX,(void **)canceled,0,2), !bVar1 &&
         (bVar1 = QtMocHelpers::indexOfMethod<void(QFutureWatcherBase::*)()>
                            (in_RCX,(void **)paused,0,3), !bVar1)) &&
        ((bVar1 = QtMocHelpers::indexOfMethod<void(QFutureWatcherBase::*)()>
                            (in_RCX,(void **)suspending,0,4), !bVar1 &&
         ((bVar1 = QtMocHelpers::indexOfMethod<void(QFutureWatcherBase::*)()>
                             (in_RCX,(void **)suspended,0,5), !bVar1 &&
          (bVar1 = QtMocHelpers::indexOfMethod<void(QFutureWatcherBase::*)()>
                             (in_RCX,(void **)resumed,0,6), !bVar1)))))) &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QFutureWatcherBase::*)(int)>
                          (in_RCX,(void **)resultReadyAt,0,7), !bVar1)))) &&
     (((bVar1 = QtMocHelpers::indexOfMethod<void(QFutureWatcherBase::*)(int,int)>
                          (in_RCX,(void **)resultsReadyAt,0,8), !bVar1 &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QFutureWatcherBase::*)(int,int)>
                          (in_RCX,(void **)progressRangeChanged,0,9), !bVar1)) &&
      (bVar1 = QtMocHelpers::indexOfMethod<void(QFutureWatcherBase::*)(int)>
                         (in_RCX,(void **)progressValueChanged,0,10), !bVar1)))) {
    QtMocHelpers::indexOfMethod<void(QFutureWatcherBase::*)(QString_const&)>
              (in_RCX,(void **)progressTextChanged,0,0xb);
  }
  return;
}

Assistant:

void QFutureWatcherBase::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFutureWatcherBase *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->started(); break;
        case 1: _t->finished(); break;
        case 2: _t->canceled(); break;
        case 3: _t->paused(); break;
        case 4: _t->suspending(); break;
        case 5: _t->suspended(); break;
        case 6: _t->resumed(); break;
        case 7: _t->resultReadyAt((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 8: _t->resultsReadyAt((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 9: _t->progressRangeChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 10: _t->progressValueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 11: _t->progressTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 12: _t->cancel(); break;
        case 13: _t->setSuspended((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 14: _t->suspend(); break;
        case 15: _t->resume(); break;
        case 16: _t->toggleSuspended(); break;
        case 17: _t->setPaused((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 18: _t->pause(); break;
        case 19: _t->togglePaused(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::started, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::finished, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::canceled, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::paused, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::suspending, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::suspended, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::resumed, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)(int )>(_a, &QFutureWatcherBase::resultReadyAt, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)(int , int )>(_a, &QFutureWatcherBase::resultsReadyAt, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)(int , int )>(_a, &QFutureWatcherBase::progressRangeChanged, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)(int )>(_a, &QFutureWatcherBase::progressValueChanged, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)(const QString & )>(_a, &QFutureWatcherBase::progressTextChanged, 11))
            return;
    }
}